

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,int>>::emplace<QString_const&,int&>
          (QMovableArrayOps<std::pair<QString,int>> *this,qsizetype i,QString *args,int *args_1)

{
  long *plVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  piVar3 = *(int **)this;
  if ((piVar3 != (int *)0x0) && (*piVar3 < 2)) {
    lVar8 = *(long *)(this + 0x10);
    if ((lVar8 == i) &&
       (lVar4 = *(long *)(this + 8),
       *(long *)(piVar3 + 2) !=
       ((long)(lVar4 - ((long)piVar3 + 0x1fU & 0xfffffffffffffff0)) >> 5) + i)) {
      lVar10 = i * 0x20;
      pDVar6 = (args->d).d;
      *(Data **)(lVar4 + lVar10) = pDVar6;
      *(char16_t **)(lVar4 + 8 + lVar10) = (args->d).ptr;
      *(qsizetype *)(lVar4 + 0x10 + lVar10) = (args->d).size;
      lVar8 = i;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        lVar8 = *(long *)(this + 0x10);
      }
      *(int *)(lVar4 + lVar10 + 0x18) = *args_1;
      goto LAB_00490f20;
    }
    if ((i == 0) &&
       (uVar5 = *(ulong *)(this + 8), ((long)piVar3 + 0x1fU & 0xfffffffffffffff0) != uVar5)) {
      pDVar6 = (args->d).d;
      *(Data **)(uVar5 - 0x20) = pDVar6;
      *(char16_t **)(uVar5 - 0x18) = (args->d).ptr;
      *(qsizetype *)(uVar5 - 0x10) = (args->d).size;
      uVar9 = uVar5;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        uVar9 = *(ulong *)(this + 8);
        lVar8 = *(long *)(this + 0x10);
      }
      *(int *)(uVar5 - 8) = *args_1;
      *(ulong *)(this + 8) = uVar9 - 0x20;
      goto LAB_00490f20;
    }
  }
  pDVar6 = (args->d).d;
  pcVar7 = (args->d).ptr;
  lVar8 = (args->d).size;
  if (pDVar6 != (Data *)0x0) {
    LOCK();
    (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  iVar2 = *args_1;
  lVar4 = *(long *)(this + 0x10);
  QArrayDataPointer<std::pair<QString,_int>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QString,_int>_> *)this,(uint)(i == 0 && lVar4 != 0),1,
             (pair<QString,_int> **)0x0,(QArrayDataPointer<std::pair<QString,_int>_> *)0x0);
  lVar10 = *(long *)(this + 8);
  if (i == 0 && lVar4 != 0) {
    *(Data **)(lVar10 + -0x20) = pDVar6;
    *(char16_t **)(lVar10 + -0x18) = pcVar7;
    *(long *)(lVar10 + -0x10) = lVar8;
    *(int *)(lVar10 + -8) = iVar2;
    *(long *)(this + 8) = lVar10 + -0x20;
    lVar8 = *(long *)(this + 0x10);
  }
  else {
    plVar1 = (long *)(lVar10 + i * 0x20);
    memmove(plVar1 + 4,(void *)(lVar10 + i * 0x20),(*(long *)(this + 0x10) - i) * 0x20);
    *plVar1 = (long)pDVar6;
    plVar1[1] = (long)pcVar7;
    plVar1[2] = lVar8;
    *(int *)(plVar1 + 3) = iVar2;
    lVar8 = *(long *)(this + 0x10);
  }
LAB_00490f20:
  *(long *)(this + 0x10) = lVar8 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }